

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

void Gia_ManCreateRefs(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  uint *puVar5;
  int *piVar6;
  size_t sVar7;
  uint uVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  int iVar11;
  size_t __nmemb;
  
  if (p->pRefs != (int *)0x0) {
    __assert_fail("p->pRefs == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x2cf,"void Gia_ManCreateRefs(Gia_Man_t *)");
  }
  iVar3 = p->nObjs;
  __nmemb = (size_t)iVar3;
  piVar6 = (int *)calloc(__nmemb,4);
  p->pRefs = piVar6;
  if ((0 < (long)__nmemb) && (pGVar4 = p->pObjs, pGVar4 != (Gia_Obj_t *)0x0)) {
    pGVar1 = pGVar4 + __nmemb;
    sVar7 = 0;
    do {
      pGVar9 = pGVar4 + sVar7;
      iVar11 = (int)*(ulong *)pGVar9;
      uVar10 = *(ulong *)pGVar9 & 0x1fffffff;
      if (uVar10 == 0x1fffffff || iVar11 < 0) {
        if (iVar11 < 0 && (int)uVar10 != 0x1fffffff) {
          pGVar9 = pGVar9 + -uVar10;
LAB_0078784a:
          if ((pGVar9 < pGVar4) || (pGVar1 <= pGVar9)) {
LAB_0078787a:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          piVar6[(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555] =
               piVar6[(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555] + 1;
        }
      }
      else {
        pGVar2 = pGVar9 + -uVar10;
        if ((pGVar2 < pGVar4) || (pGVar1 <= pGVar2)) goto LAB_0078787a;
        piVar6[(int)((ulong)((long)pGVar2 - (long)pGVar4) >> 2) * -0x55555555] =
             piVar6[(int)((ulong)((long)pGVar2 - (long)pGVar4) >> 2) * -0x55555555] + 1;
        pGVar9 = pGVar9 + -(ulong)(*(uint *)&pGVar9->field_0x4 & 0x1fffffff);
        if ((pGVar9 < pGVar4) || (pGVar1 <= pGVar9)) goto LAB_0078787a;
        piVar6[(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555] =
             piVar6[(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555] + 1;
        puVar5 = p->pMuxes;
        if ((puVar5 != (uint *)0x0) && (puVar5[sVar7] != 0)) {
          if (puVar5 == (uint *)0x0) {
            pGVar9 = (Gia_Obj_t *)0x0;
          }
          else {
            if ((int)puVar5[sVar7] < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf2,"int Abc_Lit2Var(int)");
            }
            uVar8 = puVar5[sVar7] >> 1;
            if (iVar3 <= (int)uVar8) {
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            pGVar9 = pGVar4 + uVar8;
          }
          goto LAB_0078784a;
        }
      }
      sVar7 = sVar7 + 1;
    } while (sVar7 != __nmemb);
  }
  return;
}

Assistant:

void Gia_ManCreateRefs( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i;
    assert( p->pRefs == NULL );
    p->pRefs = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjRefFanin0Inc( p, pObj );
            Gia_ObjRefFanin1Inc( p, pObj );
            if ( Gia_ObjIsMuxId(p, i) )
                Gia_ObjRefFanin2Inc( p, pObj );
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjRefFanin0Inc( p, pObj );
    }
}